

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_crc32.cc
# Opt level: O0

void __thiscall CCRC32::Init_CRC32_Table(CCRC32 *this)

{
  uint uVar1;
  CCRC32 *in_RDI;
  int j;
  int i;
  uint ulPolynomial;
  uint local_28;
  int local_14;
  uint local_10;
  
  for (local_10 = 0; (int)local_10 < 0x100; local_10 = local_10 + 1) {
    uVar1 = Reflect(in_RDI,local_10,'\b');
    in_RDI->crc32_table[(int)local_10] = uVar1 << 0x18;
    for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
      if ((in_RDI->crc32_table[(int)local_10] & 0x80000000) == 0) {
        local_28 = 0;
      }
      else {
        local_28 = 0x4c11db7;
      }
      in_RDI->crc32_table[(int)local_10] = in_RDI->crc32_table[(int)local_10] << 1 ^ local_28;
    }
    uVar1 = Reflect(in_RDI,in_RDI->crc32_table[(int)local_10],' ');
    in_RDI->crc32_table[(int)local_10] = uVar1;
  }
  return;
}

Assistant:

void CCRC32::Init_CRC32_Table()
{
	// This is the official polynomial used by CRC-32 in PKZip, WinZip and Ethernet. 
	//unsigned long ulPolynomial = 0x04c11db7;
    unsigned int ulPolynomial = 0x04c11db7;

	// 256 values representing ASCII character codes.
	for(int i = 0; i <= 0xFF; i++)
	{
		crc32_table[i]=Reflect(i, 8) << 24;
        //if (i == 1)printf("old1--i=%d,crc32_table[%d] = %lu\r\n",i,i,crc32_table[i]);
        
		for (int j = 0; j < 8; j++)
        {
            //if(i == 1)
            //{
            //    unsigned int tmp1 = (crc32_table[i] << 1);
            //    unsigned int tmp2 = (crc32_table[i] & (1 << 31) ? ulPolynomial : 0);
            //    unsigned int tmp3 = tmp1 ^ tmp2;
            //    tmp3 += 1;
            //    tmp3 -= 1;
            //
            //}
            
			crc32_table[i] = (crc32_table[i] << 1) ^ (crc32_table[i] & (1 << 31) ? ulPolynomial : 0);
            //if (i == 1)printf("old3--i=%d,crc32_table[%d] = %lu\r\n",i,i,crc32_table[i]);
        }
        //if (i == 1)printf("old2--i=%d,crc32_table[%d] = %lu\r\n",i,i,crc32_table[i]);
		crc32_table[i] = Reflect(crc32_table[i], 32);
	}

}